

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

result<toml::detail::none_t,_toml::error_info> *
toml::detail::parse_table<toml::type_config>
          (result<toml::detail::none_t,_toml::error_info> *__return_storage_ptr__,location *loc,
          context<toml::type_config> *ctx,basic_value<toml::type_config> *table)

{
  vector<toml::error_info,_std::allocator<toml::error_info>_> *this;
  pointer peVar1;
  pointer peVar2;
  element_type *peVar3;
  long lVar4;
  undefined1 uVar5;
  undefined4 uVar6;
  undefined8 uVar7;
  byte bVar8;
  table_format_info *ptVar9;
  value_type *pvVar10;
  error_type *peVar11;
  error_info *peVar12;
  error_type *peVar13;
  table_type *current_table_ptr;
  error_type *peVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *com;
  undefined8 __x;
  optional<toml::detail::multiline_spacer<toml::type_config>_> sp;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_738;
  result<toml::basic_value<toml::type_config>_*,_toml::error_info> ins_res;
  value_type com_opt;
  string local_698;
  string local_678;
  location start;
  type val;
  type key_reg;
  source_location local_4e0;
  result<std::pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::type_config>_>,_toml::error_info>
  kv_res;
  error_info local_318;
  error_info local_2c0;
  error_info local_268;
  region local_210;
  error_info local_1a8;
  error_info local_150;
  basic_value<toml::type_config> local_f8;
  
  this = &ctx->errors_;
  peVar1 = (ctx->errors_).super__Vector_base<toml::error_info,_std::allocator<toml::error_info>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  peVar2 = (ctx->errors_).super__Vector_base<toml::error_info,_std::allocator<toml::error_info>_>.
           _M_impl.super__Vector_impl_data._M_start;
  ptVar9 = basic_value<toml::type_config>::as_table_fmt(table);
  ptVar9->indent_type = none;
  bVar8 = 1;
  do {
    peVar3 = (loc->source_).
             super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    if ((ulong)((long)(peVar3->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)(peVar3->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_start) <= loc->location_) {
LAB_0032d6d5:
      if ((ulong)((long)peVar1 - (long)peVar2) <
          (ulong)((long)(ctx->errors_).
                        super__Vector_base<toml::error_info,_std::allocator<toml::error_info>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)(ctx->errors_).
                       super__Vector_base<toml::error_info,_std::allocator<toml::error_info>_>.
                       _M_impl.super__Vector_impl_data._M_start)) {
        context<toml::type_config>::pop_last_error((error_info *)&kv_res,ctx);
        err<toml::error_info>((failure<toml::error_info> *)&local_1a8,(error_info *)&kv_res);
        result<toml::detail::none_t,_toml::error_info>::result
                  (__return_storage_ptr__,(failure_type *)&local_1a8);
        error_info::~error_info(&local_1a8);
        error_info::~error_info((error_info *)&kv_res);
      }
      else {
        __return_storage_ptr__->is_ok_ = true;
      }
      return __return_storage_ptr__;
    }
    location::location(&start,loc);
    skip_multiline_spacer<toml::type_config>(&sp,loc,ctx,(bool)(bVar8 & 1));
    peVar3 = (loc->source_).
             super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    if ((ulong)((long)(peVar3->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)(peVar3->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_start) <= loc->location_) {
LAB_0032d6be:
      std::_Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>::_M_reset
                ((_Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_> *)&sp);
      location::~location(&start);
      goto LAB_0032d6d5;
    }
    syntax::ws((repeat_at_least *)&key_reg,&ctx->toml_spec_);
    ins_res._0_8_ = &PTR__scanner_base_004cc8e0;
    ins_res.field_1._0_1_ = 0x5b;
    sequence::sequence<toml::detail::repeat_at_least,toml::detail::character>
              ((sequence *)&val,(repeat_at_least *)&key_reg,(character *)&ins_res);
    sequence::scan((region *)&kv_res,(sequence *)&val,loc);
    lVar4 = CONCAT71(kv_res._1_7_,kv_res.is_ok_);
    region::~region((region *)&kv_res);
    std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
    ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_> *
            )&val.field_1.boolean_);
    if (key_reg.source_name_._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)key_reg.source_name_._M_dataplus._M_p + 8))();
    }
    uVar5 = sp.super__Optional_base<toml::detail::multiline_spacer<toml::type_config>,_false,_false>
            ._M_payload.
            super__Optional_payload<toml::detail::multiline_spacer<toml::type_config>,_true,_false,_false>
            .super__Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>.
            _M_payload._M_value.indent_type;
    if (lVar4 != 0) {
      location::operator=(loc,&start);
      goto LAB_0032d6be;
    }
    if ((bVar8 & 1) == 0) {
      if (((sp.super__Optional_base<toml::detail::multiline_spacer<toml::type_config>,_false,_false>
            ._M_payload.
            super__Optional_payload<toml::detail::multiline_spacer<toml::type_config>,_true,_false,_false>
            .super__Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>.
            _M_engaged & 1U) == 0) ||
         (sp.super__Optional_base<toml::detail::multiline_spacer<toml::type_config>,_false,_false>.
          _M_payload.
          super__Optional_payload<toml::detail::multiline_spacer<toml::type_config>,_true,_false,_false>
          .super__Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>.
          _M_payload._M_value.newline_found == false)) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_678,"toml::parse_table: newline (LF / CRLF) or EOF is expected",
                   (allocator<char> *)&key_reg);
        region::region((region *)&kv_res,loc);
        source_location::source_location(&local_4e0,(region *)&kv_res);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_698,"here",(allocator<char> *)&ins_res);
        make_error_info<>((error_info *)&val,&local_678,&local_4e0,&local_698);
        err<toml::error_info>((failure<toml::error_info> *)&local_150,(error_info *)&val);
        result<toml::detail::none_t,_toml::error_info>::result
                  (__return_storage_ptr__,(failure_type *)&local_150);
        error_info::~error_info(&local_150);
        error_info::~error_info((error_info *)&val);
        std::__cxx11::string::~string((string *)&local_698);
        source_location::~source_location(&local_4e0);
        region::~region((region *)&kv_res);
        std::__cxx11::string::~string((string *)&local_678);
        std::_Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>::_M_reset
                  ((_Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_> *)&sp
                  );
        location::~location(&start);
        return __return_storage_ptr__;
      }
LAB_0032d3c8:
      if (sp.super__Optional_base<toml::detail::multiline_spacer<toml::type_config>,_false,_false>.
          _M_payload.
          super__Optional_payload<toml::detail::multiline_spacer<toml::type_config>,_true,_false,_false>
          .super__Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>.
          _M_payload._M_value.indent_type != none) {
        ptVar9 = basic_value<toml::type_config>::as_table_fmt(table);
        uVar6 = sp.
                super__Optional_base<toml::detail::multiline_spacer<toml::type_config>,_false,_false>
                ._M_payload.
                super__Optional_payload<toml::detail::multiline_spacer<toml::type_config>,_true,_false,_false>
                .super__Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>.
                _M_payload._M_value.indent;
        ptVar9->indent_type = uVar5;
        if (sp.super__Optional_base<toml::detail::multiline_spacer<toml::type_config>,_false,_false>
            ._M_payload.
            super__Optional_payload<toml::detail::multiline_spacer<toml::type_config>,_true,_false,_false>
            .super__Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>.
            _M_engaged == false) {
          std::__throw_bad_optional_access();
        }
        ptVar9 = basic_value<toml::type_config>::as_table_fmt(table);
        ptVar9->body_indent = uVar6;
      }
    }
    else if ((sp.
              super__Optional_base<toml::detail::multiline_spacer<toml::type_config>,_false,_false>.
              _M_payload.
              super__Optional_payload<toml::detail::multiline_spacer<toml::type_config>,_true,_false,_false>
              .super__Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>.
              _M_engaged & 1U) != 0) goto LAB_0032d3c8;
    parse_key_value_pair<toml::type_config>(&kv_res,loc,ctx);
    if (kv_res.is_ok_ == true) {
      pvVar10 = result<std::pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::type_config>_>,_toml::error_info>
                ::unwrap(&kv_res,(source_location)0x4cce60);
      local_738.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pvVar10->first).first.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_738.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pvVar10->first).first.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_738.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pvVar10->first).first.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      (pvVar10->first).first.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pvVar10->first).first.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (pvVar10->first).first.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pvVar10 = result<std::pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::type_config>_>,_toml::error_info>
                ::unwrap(&kv_res,(source_location)0x4cce78);
      region::region(&key_reg,&(pvVar10->first).second);
      pvVar10 = result<std::pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::type_config>_>,_toml::error_info>
                ::unwrap(&kv_res,(source_location)0x4cce90);
      basic_value<toml::type_config>::basic_value(&val,&pvVar10->second);
      uVar7 = sp.
              super__Optional_base<toml::detail::multiline_spacer<toml::type_config>,_false,_false>.
              _M_payload.
              super__Optional_payload<toml::detail::multiline_spacer<toml::type_config>,_true,_false,_false>
              .super__Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>.
              _M_payload._M_value.comments.comments.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
      __x = sp.super__Optional_base<toml::detail::multiline_spacer<toml::type_config>,_false,_false>
            ._M_payload.
            super__Optional_payload<toml::detail::multiline_spacer<toml::type_config>,_true,_false,_false>
            .super__Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>.
            _M_payload._M_value.comments.comments.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
      if (sp.super__Optional_base<toml::detail::multiline_spacer<toml::type_config>,_false,_false>.
          _M_payload.
          super__Optional_payload<toml::detail::multiline_spacer<toml::type_config>,_true,_false,_false>
          .super__Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>.
          _M_engaged == true) {
        for (; __x != uVar7; __x = (value_type *)(__x + 0x20)) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&val.comments_.comments,(value_type *)__x);
        }
      }
      parse_comment_line<toml::type_config>
                ((result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                  *)&ins_res,loc,ctx);
      if (ins_res.is_ok_ == true) {
        peVar12 = (error_info *)
                  result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                  ::unwrap((result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                            *)&ins_res,(source_location)0x4ccea8);
        std::
        _Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ::_Optional_base(&com_opt.
                          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                         ,(_Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                           *)peVar12);
        bVar8 = com_opt.
                super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                ._M_payload.
                super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                .
                super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ._M_engaged;
        if (com_opt.
            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
            ._M_payload.
            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ._M_engaged == true) {
          peVar12 = (error_info *)&com_opt;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&val.comments_.comments,(value_type *)peVar12);
        }
        std::
        _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&com_opt);
      }
      else {
        peVar13 = result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                  ::unwrap_err((result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                                *)&ins_res,(source_location)0x4ccec0);
        error_info::error_info(&local_268,peVar13);
        peVar12 = &local_268;
        std::vector<toml::error_info,_std::allocator<toml::error_info>_>::
        emplace_back<toml::error_info>(this,&local_268);
        error_info::~error_info(&local_268);
        bVar8 = 0;
      }
      result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
      ::cleanup((result<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_toml::error_info>
                 *)&ins_res,(EVP_PKEY_CTX *)peVar12);
      current_table_ptr = basic_value<toml::type_config>::as_table_abi_cxx11_(table);
      region::region(&local_210,&key_reg);
      basic_value<toml::type_config>::basic_value(&local_f8,&val);
      peVar12 = (error_info *)0x2;
      insert_value<toml::type_config>
                (&ins_res,dotted_keys,current_table_ptr,&local_738,&local_210,&local_f8);
      basic_value<toml::type_config>::~basic_value(&local_f8);
      region::~region(&local_210);
      if (ins_res.is_ok_ == false) {
        peVar14 = result<toml::basic_value<toml::type_config>_*,_toml::error_info>::unwrap_err
                            (&ins_res,(source_location)0x4cced8);
        error_info::error_info(&local_2c0,peVar14);
        peVar12 = &local_2c0;
        std::vector<toml::error_info,_std::allocator<toml::error_info>_>::
        emplace_back<toml::error_info>(this,&local_2c0);
        error_info::~error_info(&local_2c0);
      }
      result<toml::basic_value<toml::type_config>_*,_toml::error_info>::cleanup
                (&ins_res,(EVP_PKEY_CTX *)peVar12);
      basic_value<toml::type_config>::~basic_value(&val);
      region::~region(&key_reg);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_738);
    }
    else {
      peVar11 = result<std::pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::type_config>_>,_toml::error_info>
                ::unwrap_err(&kv_res,(source_location)0x4ccef0);
      error_info::error_info(&local_318,peVar11);
      std::vector<toml::error_info,_std::allocator<toml::error_info>_>::
      emplace_back<toml::error_info>(this,&local_318);
      error_info::~error_info(&local_318);
      peVar12 = (error_info *)ctx;
      skip_key_value_pair<toml::type_config>(loc,ctx);
      bVar8 = 0;
    }
    result<std::pair<std::pair<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_toml::detail::region>,_toml::basic_value<toml::type_config>_>,_toml::error_info>
    ::cleanup(&kv_res,(EVP_PKEY_CTX *)peVar12);
    std::_Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_>::_M_reset
              ((_Optional_payload_base<toml::detail::multiline_spacer<toml::type_config>_> *)&sp);
    location::~location(&start);
  } while( true );
}

Assistant:

result<none_t, error_info>
parse_table(location& loc, context<TC>& ctx, basic_value<TC>& table)
{
    assert(table.is_table());

    const auto num_errors = ctx.errors().size();
    const auto& spec = ctx.toml_spec();

    // clear indent info
    table.as_table_fmt().indent_type = indent_char::none;

    bool newline_found = true;
    while( ! loc.eof())
    {
        const auto start = loc;

        auto sp = skip_multiline_spacer(loc, ctx, newline_found);

        // if reached to EOF, the table ends here. return.
        if(loc.eof())
        {
            break;
        }
        // if next table is comming, return.
        if(sequence(syntax::ws(spec), character('[')).scan(loc).is_ok())
        {
            loc = start;
            break;
        }
        // otherwise, it should be a key-value pair.
        newline_found = newline_found || (sp.has_value() && sp.value().newline_found);
        if( ! newline_found)
        {
            return err(make_error_info("toml::parse_table: "
                "newline (LF / CRLF) or EOF is expected",
                source_location(region(loc)), "here"));
        }
        if(sp.has_value() && sp.value().indent_type != indent_char::none)
        {
            table.as_table_fmt().indent_type = sp.value().indent_type;
            table.as_table_fmt().body_indent = sp.value().indent;
        }

        newline_found = false; // reset
        if(auto kv_res = parse_key_value_pair(loc, ctx))
        {
            auto keys    = std::move(kv_res.unwrap().first.first);
            auto key_reg = std::move(kv_res.unwrap().first.second);
            auto val     = std::move(kv_res.unwrap().second);

            if(sp.has_value())
            {
                for(const auto& com : sp.value().comments)
                {
                    val.comments().push_back(com);
                }
            }

            if(auto com_res = parse_comment_line(loc, ctx))
            {
                if(auto com_opt = com_res.unwrap())
                {
                    val.comments().push_back(com_opt.value());
                    newline_found = true; // comment includes newline at the end
                }
            }
            else
            {
                ctx.report_error(std::move(com_res.unwrap_err()));
            }

            auto ins_res = insert_value(inserting_value_kind::dotted_keys,
                    std::addressof(table.as_table()),
                    keys, std::move(key_reg), std::move(val));
            if(ins_res.is_err())
            {
                ctx.report_error(std::move(ins_res.unwrap_err()));
            }
        }
        else
        {
            ctx.report_error(std::move(kv_res.unwrap_err()));
            skip_key_value_pair(loc, ctx);
        }
    }

    if(num_errors < ctx.errors().size())
    {
        assert(ctx.has_error()); // already reported
        return err(ctx.pop_last_error());
    }
    return ok();
}